

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv__process_open_stream(uv_stdio_container_t *container,int *pipefds,int writable)

{
  int iVar1;
  int local_28;
  int err;
  int flags;
  int writable_local;
  int *pipefds_local;
  uv_stdio_container_t *container_local;
  
  if (((container->flags & UV_CREATE_PIPE) == UV_IGNORE) || (*pipefds < 0)) {
    container_local._4_4_ = 0;
  }
  else {
    iVar1 = uv__close(pipefds[1]);
    if (iVar1 != 0) {
      abort();
    }
    pipefds[1] = -1;
    uv__nonblock_ioctl(*pipefds,1);
    if ((((container->data).stream)->type == UV_NAMED_PIPE) &&
       (*(int *)&(container->data).stream[1].data != 0)) {
      local_28 = 0x60;
    }
    else if (writable == 0) {
      local_28 = 0x20;
    }
    else {
      local_28 = 0x40;
    }
    container_local._4_4_ = uv__stream_open((container->data).stream,*pipefds,local_28);
  }
  return container_local._4_4_;
}

Assistant:

static int uv__process_open_stream(uv_stdio_container_t* container,
                                   int pipefds[2],
                                   int writable) {
  int flags;
  int err;

  if (!(container->flags & UV_CREATE_PIPE) || pipefds[0] < 0)
    return 0;

  err = uv__close(pipefds[1]);
  if (err != 0)
    abort();

  pipefds[1] = -1;
  uv__nonblock(pipefds[0], 1);

  if (container->data.stream->type == UV_NAMED_PIPE &&
      ((uv_pipe_t*)container->data.stream)->ipc)
    flags = UV_STREAM_READABLE | UV_STREAM_WRITABLE;
  else if (writable)
    flags = UV_STREAM_WRITABLE;
  else
    flags = UV_STREAM_READABLE;

  return uv__stream_open(container->data.stream, pipefds[0], flags);
}